

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O3

void ResizeQueuePages(void)

{
  int iVar1;
  DdNode ***pppDVar2;
  ulong uVar3;
  uint uVar4;
  DdNode ***__ptr;
  long lVar5;
  
  iVar1 = queuePage;
  lVar5 = (long)queuePage;
  uVar4 = queuePage + 1;
  pppDVar2 = queuePages;
  queuePage = uVar4;
  if (uVar4 == maxQueuePages) {
    pppDVar2 = (DdNode ***)malloc(lVar5 * 8 + 0x408);
    __ptr = queuePages;
    if (pppDVar2 == (DdNode ***)0x0) {
      if (iVar1 < 0) {
        if (queuePages == (DdNode ***)0x0) {
          memOut = 1;
          return;
        }
      }
      else {
        uVar3 = 0;
        do {
          if (__ptr[uVar3] != (DdNode **)0x0) {
            free(__ptr[uVar3]);
            __ptr[uVar3] = (DdNode **)0x0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      goto LAB_007ec3f0;
    }
    maxQueuePages = iVar1 + 0x81;
    if (iVar1 < 0) {
      if (queuePages == (DdNode ***)0x0) goto LAB_007ec393;
    }
    else {
      uVar3 = 0;
      do {
        pppDVar2[uVar3] = __ptr[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    free(__ptr);
  }
LAB_007ec393:
  queuePages = pppDVar2;
  __ptr = queuePages;
  currentQueuePage = (DdNode **)malloc(0x4000);
  __ptr[lVar5 + 1] = currentQueuePage;
  if (currentQueuePage != (DdNode **)0x0) {
    queuePageIndex = 0;
    return;
  }
  currentQueuePage = (DdNode **)0x0;
  if (-1 < iVar1) {
    uVar3 = 0;
    do {
      if (__ptr[uVar3] != (DdNode **)0x0) {
        free(__ptr[uVar3]);
        __ptr[uVar3] = (DdNode **)0x0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
LAB_007ec3f0:
  free(__ptr);
  queuePages = (DdNode ***)0x0;
  memOut = 1;
  return;
}

Assistant:

static void
ResizeQueuePages(void)
{
    int i;
    DdNode ***newQueuePages;

    queuePage++;
    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (queuePage == maxQueuePages) {
        newQueuePages = ABC_ALLOC(DdNode **,maxQueuePages + INITIAL_PAGES);
        if (newQueuePages == NULL) {
            for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
            ABC_FREE(queuePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxQueuePages; i++) {
                newQueuePages[i] = queuePages[i];
            }
            /* Increase total page count */
            maxQueuePages += INITIAL_PAGES;
            ABC_FREE(queuePages);
            queuePages = newQueuePages;
        }
    }
    /* Allocate a new page */
    currentQueuePage = queuePages[queuePage] = ABC_ALLOC(DdNode *,queuePageSize);
    if (currentQueuePage == NULL) {
        for (i = 0; i < queuePage; i++) ABC_FREE(queuePages[i]);
        ABC_FREE(queuePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    queuePageIndex = 0;
    return;

}